

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void recursive_encode(attr_list l,AttrBuffer b,attr_value_type t)

{
  byte bVar1;
  attr_p paVar2;
  void *__dest;
  undefined8 *puVar3;
  size_t sVar4;
  undefined2 *puVar5;
  undefined4 *puVar6;
  int i_1;
  ulong uVar7;
  char *pcVar8;
  int i;
  int iVar9;
  long lVar10;
  
  if (l->list_of_lists == 0) {
    if (t == Attr_Int4) {
      bVar1 = ((l->l).list.iattrs)->int_attr_count;
      if (bVar1 != 0) {
        __dest = add_to_tmp_buffer(b,(uint)bVar1 << 3);
        memcpy(__dest,((l->l).list.iattrs)->iattr,(ulong)bVar1 << 3);
        pcVar8 = (char *)((long)b->tmp_buffer + 1);
        *pcVar8 = *pcVar8 + bVar1;
      }
    }
    else {
      lVar10 = 0x10;
      for (uVar7 = 0; uVar7 < ((l->l).list.iattrs)->other_attr_count; uVar7 = uVar7 + 1) {
        paVar2 = (l->l).list.attributes;
        puVar3 = (undefined8 *)add_to_tmp_buffer(b,8);
        *puVar3 = *(undefined8 *)((long)paVar2 + lVar10 + -0x10);
        switch(*(undefined4 *)((long)paVar2 + lVar10 + -0xc)) {
        case 0:
        case 1:
        case 7:
        case 9:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6a0,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        case 2:
        case 8:
          puVar3 = (undefined8 *)add_to_tmp_buffer(b,8);
          *puVar3 = *(undefined8 *)((long)paVar2 + lVar10 + -8);
          break;
        case 3:
          pcVar8 = *(char **)((long)paVar2 + lVar10 + -8);
          sVar4 = strlen(pcVar8);
          iVar9 = (int)sVar4 + 1;
          goto LAB_00105c43;
        case 4:
          pcVar8 = *(char **)((long)&paVar2->attr_id + lVar10);
          iVar9 = *(int *)((long)paVar2 + lVar10 + -8);
LAB_00105c43:
          puVar5 = (undefined2 *)add_to_tmp_buffer(b,iVar9 + 5U & 0xfffffffc);
          *puVar5 = (short)iVar9;
          memcpy(puVar5 + 1,pcVar8,(long)iVar9);
          break;
        case 5:
          puVar6 = (undefined4 *)add_to_tmp_buffer(b,4);
          *puVar6 = *(undefined4 *)((long)paVar2 + lVar10 + -8);
          break;
        case 6:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6c1,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        }
        pcVar8 = (char *)((long)b->tmp_buffer + 2);
        *pcVar8 = *pcVar8 + '\x01';
        lVar10 = lVar10 + 0x18;
      }
    }
  }
  else {
    for (iVar9 = 0; iVar9 < (l->l).lists.sublist_count; iVar9 = iVar9 + 1) {
      recursive_encode(l,b,t);
    }
  }
  return;
}

Assistant:

static void
recursive_encode(attr_list l, AttrBuffer b, attr_value_type t)
{
    if (l->list_of_lists == 0) {
	switch (t) {
	case Attr_Int4: {
	    /* marshalling only int4 attributes in this pass */
	    int attr_count = l->l.list.iattrs->int_attr_count;
	    void *buffer_end;
	    if (attr_count == 0) return;
	    buffer_end = add_to_tmp_buffer(b, (unsigned)(attr_count * 
					   sizeof(int_attr)));
	    memcpy(buffer_end, &l->l.list.iattrs->iattr[0], 
		   attr_count * sizeof(int_attr));
	    ((int_attr_p) b->tmp_buffer)->int_attr_count += attr_count;
	    break;
	  }
	default: {
	    /* no bulk stuff here... marshal one by one */
	    int i;
	    for (i=0; i<l->l.list.iattrs->other_attr_count; i++) {
		attr_p attr = &l->l.list.attributes[i];
		void *buffer_end = add_to_tmp_buffer(b, 8);
		memcpy(buffer_end, attr, 8);
		switch (attr->val_type) {
		case Attr_Int4:
		case Attr_Undefined:
		case Attr_Float16:
		case Attr_Float4:
		    assert(0);
		    break;
		case Attr_Atom:
		    buffer_end = add_to_tmp_buffer(b, 4);
		    *((int*)buffer_end) = (int) (long)attr->value.u.i;
		    break;
		case Attr_Int8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value.u.l, 8);
		    break;
		case Attr_Float8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value, 8);
		    break;
		case Attr_Opaque:
		case Attr_String: {
		    void *value;
		    int len;
		    int pad_len;
		    if (attr->val_type == Attr_String) {
			value = (char*) attr->value.u.p;
			len = (int)strlen((char*)value) + 1;
		    } else {
			value = attr->value.u.o.buffer;
			len = attr->value.u.o.length;
		    }
		    pad_len = roundup4(len+2) - 2;
		    buffer_end = add_to_tmp_buffer(b, 2 + pad_len);
		    *((int2*)buffer_end) = (int2) len;
		    memcpy((char*)buffer_end + 2, value, len);
		    break;
		  }
		case Attr_List:
		    assert(0);
		    break;
		}
		((int_attr_p) b->tmp_buffer)->other_attr_count ++;
	    }
	  }
	}
    } else {
        int i;
        for (i=0; i<l->l.lists.sublist_count; i++) {
	    recursive_encode(l, b, t);
	}
    }
}